

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

bool __thiscall helics::CommonCore::checkAndProcessDisconnect(CommonCore *this)

{
  bool bVar1;
  BrokerState BVar2;
  long lVar3;
  long *in_RDI;
  ActionMessage dis_1;
  ActionMessage dis;
  ActionMessage *in_stack_000002a8;
  TranslatorFederate *in_stack_000002b0;
  ActionMessage *in_stack_000003b8;
  FilterFederate *in_stack_000003c0;
  atomic<helics::GlobalFederateId> *in_stack_fffffffffffffe18;
  ActionMessage *in_stack_fffffffffffffe20;
  ActionMessage *this_00;
  CommonCore *in_stack_fffffffffffffe28;
  undefined1 *puVar4;
  action_t in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  GlobalFederateId in_stack_fffffffffffffe44;
  GlobalFederateId local_1b0;
  Time in_stack_fffffffffffffe70;
  CommonCore *in_stack_fffffffffffffea0;
  GlobalFederateId local_d4;
  BaseType local_d0;
  GlobalFederateId local_cc;
  undefined1 local_c8 [8];
  BaseType local_c0;
  BaseType local_b8;
  byte local_1;
  
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x4a59e5);
  if ((BVar2 < TERMINATING) ||
     (BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x4a59f9), TERMINATED < BVar2)) {
    bVar1 = allDisconnected(in_stack_fffffffffffffe28);
    if (bVar1) {
      checkInFlightQueriesForDisconnect(in_stack_fffffffffffffea0);
      BrokerBase::setBrokerState
                ((BrokerBase *)in_stack_fffffffffffffe28,
                 (BrokerState)((ulong)in_stack_fffffffffffffe20 >> 0x30));
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x4a5a51);
      BaseTimeCoordinator::disconnect((BaseTimeCoordinator *)dis_1._0_8_);
      if ((*(byte *)(in_RDI + 0x43) & 1) != 0) {
        BrokerBase::writeProfilingData((BrokerBase *)in_stack_fffffffffffffe70.internalTimeCode);
      }
      puVar4 = local_c8;
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe44.gid,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe3c);
      local_d0 = *(BaseType *)((long)in_RDI + 0x14);
      GlobalFederateId::GlobalFederateId(&local_cc,(GlobalBrokerId)local_d0);
      local_c0 = local_cc.gid;
      GlobalFederateId::GlobalFederateId(&local_d4,(GlobalBrokerId)0x0);
      local_b8 = local_d4.gid;
      (**(code **)(*in_RDI + 0x358))(in_RDI,0,puVar4);
      BrokerBase::setTickForwarding((BrokerBase *)(in_RDI + 1),DISCONNECT_TIMEOUT,true);
      lVar3 = std::chrono::_V2::steady_clock::now();
      in_RDI[0x45] = lVar3;
      if (in_RDI[0x15d] != 0) {
        local_c0 = (BaseType)
                   std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffe18);
        FilterFederate::handleMessage(in_stack_000003c0,in_stack_000003b8);
      }
      local_1 = 1;
      ActionMessage::~ActionMessage(in_stack_fffffffffffffe20);
    }
    else if ((in_RDI[0x129] == 0) ||
            (bVar1 = TranslatorFederate::hasActiveTimeDependencies((TranslatorFederate *)0x4a5c05),
            bVar1)) {
      local_1 = 0;
    }
    else {
      this_00 = (ActionMessage *)&stack0xfffffffffffffe48;
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe44.gid,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe3c);
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffe44,
                 (GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
      (**(code **)(*in_RDI + 0x358))(in_RDI,0,this_00);
      local_1b0 = std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffe18);
      TranslatorFederate::handleMessage(in_stack_000002b0,in_stack_000002a8);
      local_1 = 1;
      ActionMessage::~ActionMessage(this_00);
    }
  }
  else {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool CommonCore::checkAndProcessDisconnect()
{
    if ((getBrokerState() >= BrokerState::TERMINATING) &&
        (getBrokerState() <= BrokerState::TERMINATED)) {
        return true;
    }
    if (allDisconnected()) {
        checkInFlightQueriesForDisconnect();
        setBrokerState(BrokerState::TERMINATING);
        timeCoord->disconnect();
        if (enable_profiling) {
            writeProfilingData();
        }

        ActionMessage dis(CMD_DISCONNECT);
        dis.source_id = global_broker_id_local;
        dis.dest_id = parent_broker_id;
        transmit(parent_route_id, dis);
        setTickForwarding(TickForwardingReasons::DISCONNECT_TIMEOUT, true);
        disconnectTime = std::chrono::steady_clock::now();
        if (filterFed != nullptr) {
            dis.source_id = filterFedID;
            filterFed->handleMessage(dis);
        }

        return true;
    }
    if (translatorFed != nullptr) {
        if (!translatorFed->hasActiveTimeDependencies()) {
            ActionMessage dis(CMD_DISCONNECT);
            dis.source_id = global_broker_id_local;
            transmit(parent_route_id, dis);
            dis.source_id = translatorFedID;
            translatorFed->handleMessage(dis);
            return true;
        }
    }
    return false;
}